

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jessilib::ustring_to_mbstring<char16_t>
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string)

{
  ushort uVar1;
  ulong __n;
  ushort *puVar2;
  long lVar3;
  uint uVar4;
  mbstate_t mbstate;
  char buffer [16];
  undefined8 local_50;
  char local_48 [24];
  
  puVar2 = (ushort *)in_string._M_len;
  __return_storage_ptr__->first = false;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_50 = 0;
  if (this != (jessilib *)0x0) {
    do {
      uVar1 = *puVar2;
      uVar4 = (uint)uVar1;
      lVar3 = 1;
      if (((this != (jessilib *)0x1) && ((uVar1 & 0xfc00) == 0xd800)) &&
         ((puVar2[1] & 0xfc00) == 0xdc00)) {
        uVar4 = (uint)uVar1 * 0x400 + (uint)puVar2[1] + 0xfca02400;
        lVar3 = 2;
      }
      __n = c32rtomb(local_48,uVar4,&local_50);
      if (0x10 < __n) {
        __return_storage_ptr__->first = false;
        return __return_storage_ptr__;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__return_storage_ptr__->second,local_48,__n);
      puVar2 = puVar2 + lVar3;
      this = this + -lVar3;
    } while (this != (jessilib *)0x0);
  }
  __return_storage_ptr__->first = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}